

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O3

void __thiscall
TPZSFMatrix<long_double>::TPZSFMatrix(TPZSFMatrix<long_double> *this,TPZMatrix<long_double> *A)

{
  char cVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  int iVar8;
  int64_t iVar9;
  ulong uVar10;
  longdouble *plVar11;
  int extraout_var;
  undefined4 extraout_var_00;
  long lVar12;
  long lVar13;
  int64_t c;
  long lVar14;
  longdouble in_ST0;
  longdouble lVar15;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZBaseMatrix_0186a370;
  iVar9 = (A->super_TPZBaseMatrix).fCol;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = (A->super_TPZBaseMatrix).fRow;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = iVar9;
  cVar1 = (A->super_TPZBaseMatrix).fDefPositive;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed =
       (A->super_TPZBaseMatrix).fDecomposed;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = cVar1;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSFMatrix_01868de0;
  lVar12 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  if (lVar12 != (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot call TPZBaseMatrix::Dim() for a non-square ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"matrix! Aborting...",0x13);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzbasematrix.h"
               ,0x4f);
  }
  iVar9 = TPZBaseMatrix::Dim((TPZBaseMatrix *)this);
  uVar10 = (iVar9 + 1) * lVar12 >> 1;
  plVar11 = (longdouble *)operator_new__(-(ulong)(uVar10 >> 0x3c != 0) | uVar10 << 4);
  this->fElem = plVar11;
  iVar8 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var,iVar8) != 0 && -1 < extraout_var) {
    lVar12 = 1;
    lVar13 = 0;
    do {
      lVar14 = 0;
      lVar15 = in_ST0;
      lVar2 = in_ST1;
      lVar3 = in_ST2;
      lVar4 = in_ST3;
      lVar5 = in_ST4;
      lVar6 = in_ST5;
      lVar7 = in_ST6;
      in_ST6 = in_ST7;
      do {
        in_ST5 = lVar7;
        in_ST4 = lVar6;
        in_ST3 = lVar5;
        in_ST2 = lVar4;
        in_ST1 = lVar3;
        in_ST0 = lVar2;
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(A,lVar13,lVar14);
        *plVar11 = lVar15;
        plVar11 = plVar11 + 1;
        lVar14 = lVar14 + 1;
        lVar15 = in_ST0;
        lVar2 = in_ST1;
        lVar3 = in_ST2;
        lVar4 = in_ST3;
        lVar5 = in_ST4;
        lVar6 = in_ST5;
        lVar7 = in_ST6;
      } while (lVar12 != lVar14);
      lVar13 = lVar13 + 1;
      in_ST7 = in_ST6;
      iVar8 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0xc])(this);
      lVar12 = lVar12 + 1;
    } while (lVar13 < CONCAT44(extraout_var_00,iVar8));
  }
  return;
}

Assistant:

TPZSFMatrix<TVar> ::TPZSFMatrix(const  TPZMatrix<TVar>  &A )
: TPZRegisterClassId(&TPZSFMatrix::ClassId),
TPZMatrix<TVar> ( A )
{
    int64_t size = Size();
	fElem = new TVar[size] ;
	
	if ( fElem == NULL )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Constructor <memory allocation error>." );
	
	// Copia a matriz
	TVar *dst = fElem;
	for ( int64_t r = 0; r < this->Dim(); r++ )
		for ( int64_t c = 0; c <= r; c++ )
			*dst++ = A.GetVal( r, c );
}